

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndr.h
# Opt level: O2

int Ndr_ObjReadArray(Ndr_Data_t *p,int Obj,int Type,int **ppStart)

{
  long *plVar1;
  int iVar2;
  undefined4 in_register_00000014;
  int i;
  int iVar3;
  
  plVar1 = (long *)CONCAT44(in_register_00000014,Type);
  *(undefined8 *)CONCAT44(in_register_00000014,Type) = 0;
  i = Obj + 1;
  iVar3 = 0;
  do {
    if ((int)(p->pBody[Obj] + Obj) <= i) {
      return iVar3;
    }
    iVar2 = Ndr_DataType(p,i);
    if (iVar2 == 4) {
      iVar3 = iVar3 + 1;
      if (*plVar1 == 0) {
        *plVar1 = (long)(p->pBody + i);
      }
    }
    else if (*plVar1 != 0) {
      return iVar3;
    }
    iVar2 = Ndr_DataSize(p,i);
    i = i + iVar2;
  } while( true );
}

Assistant:

static inline int Ndr_ObjReadArray( Ndr_Data_t * p, int Obj, int Type, int ** ppStart )
{
    int Ent, Counter = 0; *ppStart = NULL;
    Ndr_ObjForEachEntry( p, Obj, Ent )
        if ( Ndr_DataType(p, Ent) == Type )
        {
            Counter++;
            if ( *ppStart == NULL )
                *ppStart = (int *)p->pBody + Ent;
        }
        else if ( *ppStart )
            return Counter;
    return Counter;
}